

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O2

ElementPtr __thiscall
Rml::ElementInstancerText::InstanceElement
          (ElementInstancerText *this,Element *param_1,String *tag,XMLAttributes *param_3)

{
  ElementInstancerPools *pEVar1;
  ElementText *pEVar2;
  
  pEVar1 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                     ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                      element_instancer_pools);
  pEVar2 = Pool<Rml::ElementText>::AllocateAndConstruct<std::__cxx11::string_const&>
                     (&pEVar1->pool_text_default,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_3);
  (this->super_ElementInstancer)._vptr_ElementInstancer = (_func_int **)pEVar2;
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr ElementInstancerText::InstanceElement(Element* /*parent*/, const String& tag, const XMLAttributes& /*attributes*/)
{
	ElementText* ptr = element_instancer_pools->pool_text_default.AllocateAndConstruct(tag);
	return ElementPtr(static_cast<Element*>(ptr));
}